

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-h2-proxy.c
# Opt level: O0

CURLcode Curl_cf_h2_proxy_insert_after(Curl_cfilter *cf,Curl_easy *data)

{
  cf_h2_proxy_ctx *ctx_00;
  CURLcode local_2c;
  CURLcode result;
  cf_h2_proxy_ctx *ctx;
  Curl_cfilter *cf_h2_proxy;
  Curl_easy *data_local;
  Curl_cfilter *cf_local;
  
  ctx = (cf_h2_proxy_ctx *)0x0;
  local_2c = CURLE_OUT_OF_MEMORY;
  cf_h2_proxy = (Curl_cfilter *)data;
  data_local = (Curl_easy *)cf;
  ctx_00 = (cf_h2_proxy_ctx *)(*Curl_ccalloc)(1,0x148);
  if ((ctx_00 != (cf_h2_proxy_ctx *)0x0) &&
     (local_2c = Curl_cf_create((Curl_cfilter **)&ctx,&Curl_cft_h2_proxy,ctx_00),
     local_2c == CURLE_OK)) {
    Curl_conn_cf_insert_after((Curl_cfilter *)data_local,(Curl_cfilter *)ctx);
    local_2c = CURLE_OK;
  }
  if (local_2c != CURLE_OK) {
    cf_h2_proxy_ctx_free(ctx_00);
  }
  return local_2c;
}

Assistant:

CURLcode Curl_cf_h2_proxy_insert_after(struct Curl_cfilter *cf,
                                       struct Curl_easy *data)
{
  struct Curl_cfilter *cf_h2_proxy = NULL;
  struct cf_h2_proxy_ctx *ctx;
  CURLcode result = CURLE_OUT_OF_MEMORY;

  (void)data;
  ctx = calloc(1, sizeof(*ctx));
  if(!ctx)
    goto out;

  result = Curl_cf_create(&cf_h2_proxy, &Curl_cft_h2_proxy, ctx);
  if(result)
    goto out;

  Curl_conn_cf_insert_after(cf, cf_h2_proxy);
  result = CURLE_OK;

out:
  if(result)
    cf_h2_proxy_ctx_free(ctx);
  return result;
}